

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O0

NaLinearControlKind StrToLinControlKindIO(char *s)

{
  int iVar1;
  undefined4 *puVar2;
  char *pcVar3;
  char *in_RDI;
  NaLinearControlKind local_4;
  
  if (in_RDI == (char *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  pcVar3 = LinControlKindToStrIO(lckGain);
  iVar1 = strcmp(pcVar3,in_RDI);
  if (iVar1 == 0) {
    local_4 = lckGain;
  }
  else {
    pcVar3 = LinControlKindToStrIO(lckInertial);
    iVar1 = strcmp(pcVar3,in_RDI);
    if (iVar1 == 0) {
      local_4 = lckInertial;
    }
    else {
      pcVar3 = LinControlKindToStrIO(lckIntegral);
      iVar1 = strcmp(pcVar3,in_RDI);
      if (iVar1 == 0) {
        local_4 = lckIntegral;
      }
      else {
        pcVar3 = LinControlKindToStrIO(lckDifferential);
        iVar1 = strcmp(pcVar3,in_RDI);
        if (iVar1 == 0) {
          local_4 = lckDifferential;
        }
        else {
          pcVar3 = LinControlKindToStrIO(lckDiffStatic);
          iVar1 = strcmp(pcVar3,in_RDI);
          if (iVar1 == 0) {
            local_4 = lckDiffStatic;
          }
          else {
            pcVar3 = LinControlKindToStrIO(lckOscillation);
            iVar1 = strcmp(pcVar3,in_RDI);
            if (iVar1 == 0) {
              local_4 = lckOscillation;
            }
            else {
              pcVar3 = LinControlKindToStrIO(lckConservative);
              iVar1 = strcmp(pcVar3,in_RDI);
              if (iVar1 == 0) {
                local_4 = lckConservative;
              }
              else {
                pcVar3 = LinControlKindToStrIO(lckDelay);
                iVar1 = strcmp(pcVar3,in_RDI);
                if (iVar1 == 0) {
                  local_4 = lckDelay;
                }
                else {
                  local_4 = __lckNumber;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

NaLinearControlKind
StrToLinControlKindIO (const char* s)
{
    if(NULL == s)
        throw(na_null_pointer);

    if(!strcmp(LinControlKindToStrIO(lckGain), s))
        return lckGain;
    else if(!strcmp(LinControlKindToStrIO(lckInertial), s))
        return lckInertial;
    else if(!strcmp(LinControlKindToStrIO(lckIntegral), s))
        return lckIntegral;
    else if(!strcmp(LinControlKindToStrIO(lckDifferential), s))
        return lckDifferential;
    else if(!strcmp(LinControlKindToStrIO(lckDiffStatic), s))
        return lckDiffStatic;
    else if(!strcmp(LinControlKindToStrIO(lckOscillation), s))
        return lckOscillation;
    else if(!strcmp(LinControlKindToStrIO(lckConservative), s))
        return lckConservative;
    else if(!strcmp(LinControlKindToStrIO(lckDelay), s))
        return lckDelay;
    return __lckNumber;
}